

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::DataTypeApplyOp(ImGuiDataType data_type,int op,void *output,void *arg1,void *arg2)

{
  char cVar1;
  short sVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  short sVar8;
  long lVar9;
  char cVar10;
  short sVar11;
  int iVar12;
  bool bVar13;
  float fVar14;
  double dVar15;
  
  switch(data_type) {
  case 0:
    if (op == 0x2d) {
      cVar4 = *arg1;
      cVar1 = *arg2;
      cVar10 = -0x80;
      if (cVar1 < '\x01' || (int)((int)cVar1 | 0xffffff80U) <= (int)cVar4) {
        cVar10 = '\x7f';
        if ((int)cVar4 <= (int)((int)cVar1 + 0x7fU)) {
          cVar10 = cVar4 - cVar1;
        }
        if (-1 < cVar1) {
          cVar10 = cVar4 - cVar1;
        }
      }
    }
    else {
      if (op != 0x2b) {
        return;
      }
      cVar4 = *arg1;
      cVar1 = *arg2;
      cVar10 = -0x80;
      if (-1 < cVar1 || -0x80 - cVar1 <= (int)cVar4) {
        cVar10 = '\x7f';
        if ((int)cVar4 <= 0x7f - cVar1) {
          cVar10 = cVar4 + cVar1;
        }
        if (cVar1 < '\x01') {
          cVar10 = cVar4 + cVar1;
        }
      }
    }
    *(char *)output = cVar10;
    return;
  case 1:
    if (op == 0x2d) {
      cVar4 = *arg1 - *arg2;
      if (*arg1 < *arg2) {
        cVar4 = '\0';
      }
      *(char *)output = cVar4;
      return;
    }
    if (op == 0x2b) {
      cVar4 = -1;
      if (!CARRY1(*arg2,*arg1)) {
        cVar4 = *arg2 + *arg1;
      }
      *(char *)output = cVar4;
      return;
    }
    break;
  case 2:
    if (op == 0x2d) {
      sVar8 = *arg1;
      sVar2 = *arg2;
      sVar11 = -0x8000;
      if (sVar2 < 1 || (int)((int)sVar2 | 0xffff8000U) <= (int)sVar8) {
        sVar11 = 0x7fff;
        if ((int)sVar8 <= (int)((int)sVar2 + 0x7fffU)) {
          sVar11 = sVar8 - sVar2;
        }
        if (-1 < sVar2) {
          sVar11 = sVar8 - sVar2;
        }
      }
    }
    else {
      if (op != 0x2b) {
        return;
      }
      sVar8 = *arg1;
      sVar2 = *arg2;
      sVar11 = -0x8000;
      if (-1 < sVar2 || -0x8000 - sVar2 <= (int)sVar8) {
        sVar11 = 0x7fff;
        if ((int)sVar8 <= 0x7fff - sVar2) {
          sVar11 = sVar2 + sVar8;
        }
        if (sVar2 < 1) {
          sVar11 = sVar2 + sVar8;
        }
      }
    }
    *(short *)output = sVar11;
    return;
  case 3:
    if (op == 0x2d) {
      sVar8 = *arg1 - *arg2;
      if (*arg1 < *arg2) {
        sVar8 = 0;
      }
      *(short *)output = sVar8;
      return;
    }
    if (op == 0x2b) {
      sVar8 = -1;
      if (!CARRY2(*arg2,*arg1)) {
        sVar8 = *arg2 + *arg1;
      }
      *(short *)output = sVar8;
      return;
    }
    break;
  case 4:
    if (op == 0x2d) {
      iVar5 = *arg1;
      uVar3 = *arg2;
      iVar12 = -0x80000000;
      if ((int)uVar3 < 1 || (int)(uVar3 | 0x80000000) <= iVar5) {
        iVar12 = 0x7fffffff;
        if (iVar5 <= (int)(uVar3 + 0x7fffffff)) {
          iVar12 = iVar5 - uVar3;
        }
        if (-1 < (int)uVar3) {
          iVar12 = iVar5 - uVar3;
        }
      }
      *(int *)output = iVar12;
      return;
    }
    if (op == 0x2b) {
      iVar12 = *arg1;
      uVar3 = *arg2;
      iVar5 = -0x80000000;
      if (-1 < (int)uVar3 || (int)(-0x80000000 - uVar3) <= iVar12) {
        iVar5 = 0x7fffffff;
        if (iVar12 <= (int)(uVar3 ^ 0x7fffffff)) {
          iVar5 = uVar3 + iVar12;
        }
        if ((int)uVar3 < 1) {
          iVar5 = uVar3 + iVar12;
        }
      }
LAB_0020165d:
      *(int *)output = iVar5;
      return;
    }
    break;
  case 5:
    if (op == 0x2d) {
      iVar5 = *arg1 - *arg2;
      if (*arg1 < *arg2) {
        iVar5 = 0;
      }
      goto LAB_0020165d;
    }
    if (op == 0x2b) {
      iVar5 = -1;
      if (!CARRY4(*arg2,*arg1)) {
        iVar5 = *arg2 + *arg1;
      }
      *(int *)output = iVar5;
      return;
    }
    break;
  case 6:
    if (op == 0x2d) {
      lVar9 = *arg1;
      lVar6 = *arg2;
      if ((lVar6 < 1) || (lVar6 + -0x8000000000000000 <= lVar9)) {
        lVar7 = 0x7fffffffffffffff;
        if (lVar9 <= lVar6 + 0x7fffffffffffffff) {
          lVar7 = lVar9 - lVar6;
        }
        if (-1 < lVar6) {
          lVar7 = lVar9 - lVar6;
        }
      }
      else {
        lVar7 = -0x8000000000000000;
      }
      *(long *)output = lVar7;
      return;
    }
    if (op == 0x2b) {
      lVar9 = *arg1;
      lVar6 = *arg2;
      if ((-1 < lVar6) || (lVar7 = -0x8000000000000000, -0x8000000000000000 - lVar6 <= lVar9)) {
        lVar7 = 0x7fffffffffffffff;
        if (lVar9 <= 0x7fffffffffffffff - lVar6) {
          lVar7 = lVar6 + lVar9;
        }
        if (lVar6 < 1) {
          lVar7 = lVar6 + lVar9;
        }
      }
      *(long *)output = lVar7;
      return;
    }
    break;
  case 7:
    if (op == 0x2d) {
      lVar9 = 0;
      bVar13 = *arg1 < *arg2;
      lVar6 = *arg1 - *arg2;
    }
    else {
      if (op != 0x2b) {
        return;
      }
      bVar13 = CARRY8(*arg2,*arg1);
      lVar6 = *arg2 + *arg1;
      lVar9 = -1;
    }
    if (!bVar13) {
      lVar9 = lVar6;
    }
    *(long *)output = lVar9;
    return;
  case 8:
    if (op == 0x2d) {
      fVar14 = *arg1 - *arg2;
    }
    else {
      if (op != 0x2b) {
        return;
      }
      fVar14 = *arg1 + *arg2;
    }
    *(float *)output = fVar14;
    return;
  case 9:
    if (op == 0x2d) {
      dVar15 = *arg1 - *arg2;
    }
    else {
      if (op != 0x2b) {
        return;
      }
      dVar15 = *arg1 + *arg2;
    }
    *(double *)output = dVar15;
  }
  return;
}

Assistant:

void ImGui::DataTypeApplyOp(ImGuiDataType data_type, int op, void* output, const void* arg1, const void* arg2)
{
    IM_ASSERT(op == '+' || op == '-');
    switch (data_type)
    {
        case ImGuiDataType_S8:
            if (op == '+') { *(ImS8*)output  = ImAddClampOverflow(*(const ImS8*)arg1,  *(const ImS8*)arg2,  IM_S8_MIN,  IM_S8_MAX); }
            if (op == '-') { *(ImS8*)output  = ImSubClampOverflow(*(const ImS8*)arg1,  *(const ImS8*)arg2,  IM_S8_MIN,  IM_S8_MAX); }
            return;
        case ImGuiDataType_U8:
            if (op == '+') { *(ImU8*)output  = ImAddClampOverflow(*(const ImU8*)arg1,  *(const ImU8*)arg2,  IM_U8_MIN,  IM_U8_MAX); }
            if (op == '-') { *(ImU8*)output  = ImSubClampOverflow(*(const ImU8*)arg1,  *(const ImU8*)arg2,  IM_U8_MIN,  IM_U8_MAX); }
            return;
        case ImGuiDataType_S16:
            if (op == '+') { *(ImS16*)output = ImAddClampOverflow(*(const ImS16*)arg1, *(const ImS16*)arg2, IM_S16_MIN, IM_S16_MAX); }
            if (op == '-') { *(ImS16*)output = ImSubClampOverflow(*(const ImS16*)arg1, *(const ImS16*)arg2, IM_S16_MIN, IM_S16_MAX); }
            return;
        case ImGuiDataType_U16:
            if (op == '+') { *(ImU16*)output = ImAddClampOverflow(*(const ImU16*)arg1, *(const ImU16*)arg2, IM_U16_MIN, IM_U16_MAX); }
            if (op == '-') { *(ImU16*)output = ImSubClampOverflow(*(const ImU16*)arg1, *(const ImU16*)arg2, IM_U16_MIN, IM_U16_MAX); }
            return;
        case ImGuiDataType_S32:
            if (op == '+') { *(ImS32*)output = ImAddClampOverflow(*(const ImS32*)arg1, *(const ImS32*)arg2, IM_S32_MIN, IM_S32_MAX); }
            if (op == '-') { *(ImS32*)output = ImSubClampOverflow(*(const ImS32*)arg1, *(const ImS32*)arg2, IM_S32_MIN, IM_S32_MAX); }
            return;
        case ImGuiDataType_U32:
            if (op == '+') { *(ImU32*)output = ImAddClampOverflow(*(const ImU32*)arg1, *(const ImU32*)arg2, IM_U32_MIN, IM_U32_MAX); }
            if (op == '-') { *(ImU32*)output = ImSubClampOverflow(*(const ImU32*)arg1, *(const ImU32*)arg2, IM_U32_MIN, IM_U32_MAX); }
            return;
        case ImGuiDataType_S64:
            if (op == '+') { *(ImS64*)output = ImAddClampOverflow(*(const ImS64*)arg1, *(const ImS64*)arg2, IM_S64_MIN, IM_S64_MAX); }
            if (op == '-') { *(ImS64*)output = ImSubClampOverflow(*(const ImS64*)arg1, *(const ImS64*)arg2, IM_S64_MIN, IM_S64_MAX); }
            return;
        case ImGuiDataType_U64:
            if (op == '+') { *(ImU64*)output = ImAddClampOverflow(*(const ImU64*)arg1, *(const ImU64*)arg2, IM_U64_MIN, IM_U64_MAX); }
            if (op == '-') { *(ImU64*)output = ImSubClampOverflow(*(const ImU64*)arg1, *(const ImU64*)arg2, IM_U64_MIN, IM_U64_MAX); }
            return;
        case ImGuiDataType_Float:
            if (op == '+') { *(float*)output = *(const float*)arg1 + *(const float*)arg2; }
            if (op == '-') { *(float*)output = *(const float*)arg1 - *(const float*)arg2; }
            return;
        case ImGuiDataType_Double:
            if (op == '+') { *(double*)output = *(const double*)arg1 + *(const double*)arg2; }
            if (op == '-') { *(double*)output = *(const double*)arg1 - *(const double*)arg2; }
            return;
        case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
}